

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

pointer poly::
        delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_std::integral_constant<bool,_true>_>
        ::clone_func<Impl1>(Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>
                            *a,pointer obj,void_pointer dest,Operation op)

{
  void *pvVar1;
  
  if (op == Clone) {
    Interface::Interface((Interface *)dest,obj);
    *(undefined ***)dest = &PTR_function_002bf7a8;
    *(_func_int ***)((long)dest + 0x18) = obj[1]._vptr_Interface;
    pvVar1 = operator_new__(0x1bc);
    *(void **)((long)dest + 0x20) = pvVar1;
    *(undefined4 *)((long)dest + 0x28) = 0xdeadbeef;
  }
  else {
    Impl1::Impl1((Impl1 *)dest,(Impl1 *)obj);
  }
  return (pointer)dest;
}

Assistant:

static pointer clone_func(const Allocator& a, pointer obj, void_pointer dest, Operation op)
    {
        using traits      = typename std::allocator_traits<Allocator>::template rebind_traits<T>;
        using obj_pointer = typename traits::pointer;
        using obj_const_pointer = typename traits::const_pointer;

        typename traits::allocator_type alloc(a);
        if (op == Clone) {
            traits::construct(
                alloc, static_cast<obj_pointer>(dest), *static_cast<obj_const_pointer>(obj));
        } else {
            traits::construct(
                alloc, static_cast<obj_pointer>(dest), std::move(*static_cast<obj_pointer>(obj)));
        }
        return static_cast<obj_pointer>(dest);
    }